

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::PostCollectionCallBack(ThreadContext *this)

{
  Recycler *this_00;
  ScriptContext *this_01;
  
  CollectionCallBack(this,Collect_End);
  TryExitExpirableCollectMode(this);
  this_00 = this->recycler;
  if ((this_00 != (Recycler *)0x0) && (this_00->inCacheCleanupCollection == true)) {
    Memory::Recycler::ClearCacheCleanupCollection(this_00);
    for (this_01 = this->scriptContextList; this_01 != (ScriptContext *)0x0; this_01 = this_01->next
        ) {
      Js::ScriptContext::CleanupWeakReferenceDictionaries(this_01);
    }
  }
  return;
}

Assistant:

void
ThreadContext::PostCollectionCallBack()
{
    CollectionCallBack(Collect_End);

    TryExitExpirableCollectMode();

    // Recycler is null in the case where the ThreadContext is in the process of creating the recycler and
    // we have a GC triggered (say because the -recyclerStress flag is passed in)
    if (this->recycler != NULL)
    {
        if (this->recycler->InCacheCleanupCollection())
        {
            this->recycler->ClearCacheCleanupCollection();
            for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
            {
                scriptContext->CleanupWeakReferenceDictionaries();
            }
        }
    }
}